

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# o3dgcTriangleFans.cpp
# Opt level: O1

O3DGCErrorCode o3dgc::LoadUIntData(Vector<long> *data,BinaryStream *bstream,unsigned_long *iterator)

{
  unsigned_long size;
  unsigned_long local_30;
  
  BinaryStream::ReadUInt32ASCII(bstream,iterator);
  size = BinaryStream::ReadUInt32ASCII(bstream,iterator);
  Vector<long>::Allocate(data,size);
  data->m_size = 0;
  if (size != 0) {
    do {
      local_30 = BinaryStream::ReadUIntASCII(bstream,iterator);
      Vector<long>::PushBack(data,(long *)&local_30);
      size = size - 1;
    } while (size != 0);
  }
  return O3DGC_OK;
}

Assistant:

O3DGCErrorCode    LoadUIntData(Vector<long> & data,
                                  const BinaryStream & bstream,
                                  unsigned long & iterator) 
    {
        bstream.ReadUInt32ASCII(iterator);
        const unsigned long size = bstream.ReadUInt32ASCII(iterator);
        data.Allocate(size);
        data.Clear();
        for(unsigned long i = 0; i < size; ++i)
        {
            data.PushBack(bstream.ReadUIntASCII(iterator));
        }
        return O3DGC_OK;
    }